

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

Url * __thiscall Vault::KeyValue::getUrl(Url *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *pCVar1;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  byte local_75;
  byte local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Path *local_20;
  Path *path_local;
  KeyValue *this_local;
  
  local_61 = 0;
  local_75 = 0;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  if (this->version_ == v1) {
    pCVar1 = this->client_;
    Vault::operator+(&local_60,"/v1/",&this->mount_);
    local_61 = 1;
    std::operator+(&local_40,&local_60,"/");
    local_75 = 1;
    (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,&local_40,local_20);
  }
  else {
    pCVar1 = this->client_;
    Vault::operator+(&local_b8,"/v1/",&this->mount_);
    std::operator+(&local_98,&local_b8,"/data/");
    (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,&local_98,local_20);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((local_75 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::KeyValue::getUrl(const Vault::Path &path) {
  return version_ == KeyValue::Version::v1
             ? client_.getUrl("/v1/" + mount_ + "/", path)
             : client_.getUrl("/v1/" + mount_ + "/data/", path);
}